

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O1

void ncnn::cubic_coeffs(int w,int outw,int *xofs,float *alpha,int align_corner)

{
  int iVar1;
  float fVar2;
  int iVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  if (align_corner == 0) {
    fVar2 = (float)outw;
    iVar1 = w;
  }
  else {
    fVar2 = (float)(outw + -1);
    iVar1 = w + -1;
  }
  if (0 < outw) {
    uVar4 = 0;
    do {
      fVar7 = ((float)(int)uVar4 + 0.5) * ((float)iVar1 / fVar2) + -0.5;
      if (align_corner != 0) {
        fVar7 = (float)(int)uVar4 * ((float)iVar1 / fVar2);
      }
      fVar5 = floorf(fVar7);
      iVar3 = (int)fVar5;
      fVar7 = fVar7 - (float)(int)fVar5;
      fVar5 = fVar7 + 1.0;
      fVar6 = 1.0 - fVar7;
      fVar5 = (3.75 - fVar5 * 0.75) * fVar5 * fVar5 + fVar5 * -6.0 + 3.0;
      fVar7 = (fVar7 * 1.25 + -2.25) * fVar7 * fVar7 + 1.0;
      *(ulong *)alpha = CONCAT44(fVar7,fVar5);
      fVar6 = (fVar6 * 1.25 + -2.25) * fVar6 * fVar6;
      alpha[2] = fVar6 + 1.0;
      alpha[3] = -(fVar7 + fVar6 + fVar5);
      if (iVar3 < 0) {
        *alpha = 1.0 - alpha[3];
        alpha[1] = alpha[3];
        alpha[2] = 0.0;
        alpha[3] = 0.0;
        iVar3 = 1;
      }
      if (iVar3 == 0) {
        *alpha = alpha[1] + *alpha;
        *(undefined8 *)(alpha + 1) = *(undefined8 *)(alpha + 2);
        alpha[3] = 0.0;
        iVar3 = 1;
      }
      if (iVar3 == w + -2) {
        alpha[3] = alpha[3] + alpha[2];
        *(undefined8 *)(alpha + 1) = *(undefined8 *)alpha;
        *alpha = 0.0;
        iVar3 = w + -3;
      }
      if (w + -1 <= iVar3) {
        alpha[3] = 1.0 - *alpha;
        alpha[2] = *alpha;
        alpha[0] = 0.0;
        alpha[1] = 0.0;
        iVar3 = w + -3;
      }
      xofs[uVar4] = iVar3;
      uVar4 = uVar4 + 1;
      alpha = alpha + 4;
    } while ((uint)outw != uVar4);
  }
  return;
}

Assistant:

static void cubic_coeffs(int w, int outw, int* xofs, float* alpha, int align_corner)
{
    double scale = (double)w / outw;
    if (align_corner)
    {
        scale = (double)(w - 1) / (outw - 1);
    }

    for (int dx = 0; dx < outw; dx++)
    {
        float fx = (float)((dx + 0.5) * scale - 0.5);
        if (align_corner)
        {
            fx = static_cast<float>(dx * scale);
        }

        int sx = static_cast<int>(floor(fx));
        fx -= sx;

        interpolate_cubic(fx, alpha + dx * 4);

        if (sx <= -1)
        {
            sx = 1;
            alpha[dx * 4 + 0] = 1.f - alpha[dx * 4 + 3];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 3];
            alpha[dx * 4 + 2] = 0.f;
            alpha[dx * 4 + 3] = 0.f;
        }
        if (sx == 0)
        {
            sx = 1;
            alpha[dx * 4 + 0] = alpha[dx * 4 + 0] + alpha[dx * 4 + 1];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 2];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 3];
            alpha[dx * 4 + 3] = 0.f;
        }
        if (sx == w - 2)
        {
            sx = w - 3;
            alpha[dx * 4 + 3] = alpha[dx * 4 + 2] + alpha[dx * 4 + 3];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 1];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 0];
            alpha[dx * 4 + 0] = 0.f;
        }
        if (sx >= w - 1)
        {
            sx = w - 3;
            alpha[dx * 4 + 3] = 1.f - alpha[dx * 4 + 0];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 0];
            alpha[dx * 4 + 1] = 0.f;
            alpha[dx * 4 + 0] = 0.f;
        }

        xofs[dx] = sx;
    }
}